

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O1

int32 ctl_read_entry(FILE *fp,char *uttfile,int32 *sf,int32 *ef,char *uttid)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char line [16384];
  char local_4038 [16392];
  
  do {
    pcVar2 = fgets(local_4038,0x4000,(FILE *)fp);
    if (pcVar2 == (char *)0x0) {
      return -1;
    }
    iVar1 = 0;
    if (local_4038[0] != '#') {
      iVar1 = __isoc99_sscanf(local_4038,"%s %d %d %s",uttfile,sf,ef,uttid);
    }
  } while (iVar1 < 1);
  if ((iVar1 != 2) && ((iVar1 < 3 || ((-1 < *sf && (*sf < *ef)))))) {
    if (iVar1 < 4) {
      pcVar2 = path2basename(uttfile);
      strcpy(uttid,pcVar2);
      if (iVar1 == 3) {
        sVar3 = strlen(uttid);
        sprintf(uttid + (int)sVar3,"_%d_%d",(ulong)(uint)*sf,(ulong)(uint)*ef);
      }
      else {
        *sf = 0;
        *ef = -1;
      }
    }
    return 0;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
          ,0x1a2,"Error in ctlfile: %s\n",local_4038);
  exit(1);
}

Assistant:

int32
ctl_read_entry(FILE * fp, char *uttfile, int32 * sf, int32 * ef,
               char *uttid)
{
    char line[16384];
    const char *base;
    int32 k;

    do {
        if (fgets(line, sizeof(line), fp) == NULL)
            return -1;
        if (line[0] == '#')
            k = 0;
        else
            k = sscanf(line, "%s %d %d %s", uttfile, sf, ef, uttid);
    } while (k <= 0);

    if ((k == 2) || ((k >= 3) && ((*sf >= *ef) || (*sf < 0))))
        E_FATAL("Error in ctlfile: %s\n", line);

    if (k < 4) {
        /* Create utt-id from mfc-filename (and sf/ef if specified) */
        base = path2basename(uttfile);
        /* strip_fileext (base, uttid); */
        strcpy(uttid, base);

        if (k == 3) {
            k = strlen(uttid);
            sprintf(uttid + k, "_%d_%d", *sf, *ef);
        }
        else {
            *sf = 0;
            *ef = -1;           /* Signifies "until EOF" */
        }
    }

    return 0;
}